

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O2

aom_codec_err_t update_encoder_cfg(aom_codec_alg_priv_t_conflict *ctx)

{
  AV1EncoderConfig *oxcf;
  AV1_PRIMARY *pAVar1;
  AV1_COMP *pAVar2;
  aom_internal_error_info *paVar3;
  int iVar4;
  ulong in_RAX;
  long lVar5;
  _Bool is_sb_size_changed;
  undefined8 uStack_38;
  
  oxcf = &ctx->oxcf;
  uStack_38 = in_RAX;
  set_encoder_config(oxcf,&ctx->cfg,&ctx->extra_cfg);
  av1_check_fpmt_config(ctx->ppi,oxcf);
  uStack_38 = uStack_38 & 0xffffffffffffff;
  av1_change_config_seq(ctx->ppi,oxcf,(_Bool *)((long)&uStack_38 + 7));
  for (lVar5 = 0; pAVar1 = ctx->ppi, lVar5 < pAVar1->num_fp_contexts; lVar5 = lVar5 + 1) {
    pAVar2 = pAVar1->parallel_cpi[lVar5];
    paVar3 = (pAVar2->common).error;
    iVar4 = _setjmp((__jmp_buf_tag *)paVar3->jmp);
    if (iVar4 != 0) {
      paVar3->setjmp = 0;
      return paVar3->error_code;
    }
    paVar3->setjmp = 1;
    av1_change_config(pAVar2,oxcf,uStack_38._7_1_);
    paVar3->setjmp = 0;
  }
  pAVar2 = pAVar1->cpi_lap;
  if (pAVar2 != (AV1_COMP *)0x0) {
    paVar3 = (pAVar2->common).error;
    iVar4 = _setjmp((__jmp_buf_tag *)paVar3->jmp);
    if (iVar4 != 0) {
      paVar3->setjmp = 0;
      return paVar3->error_code;
    }
    paVar3->setjmp = 1;
    av1_change_config(pAVar2,oxcf,uStack_38._7_1_);
    paVar3->setjmp = 0;
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t update_encoder_cfg(aom_codec_alg_priv_t *ctx) {
  set_encoder_config(&ctx->oxcf, &ctx->cfg, &ctx->extra_cfg);
  av1_check_fpmt_config(ctx->ppi, &ctx->oxcf);
  bool is_sb_size_changed = false;
  av1_change_config_seq(ctx->ppi, &ctx->oxcf, &is_sb_size_changed);
  for (int i = 0; i < ctx->ppi->num_fp_contexts; i++) {
    AV1_COMP *const cpi = ctx->ppi->parallel_cpi[i];
    struct aom_internal_error_info *const error = cpi->common.error;
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      return error->error_code;
    }
    error->setjmp = 1;
    av1_change_config(cpi, &ctx->oxcf, is_sb_size_changed);
    error->setjmp = 0;
  }
  if (ctx->ppi->cpi_lap != NULL) {
    AV1_COMP *const cpi_lap = ctx->ppi->cpi_lap;
    struct aom_internal_error_info *const error = cpi_lap->common.error;
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      return error->error_code;
    }
    error->setjmp = 1;
    av1_change_config(cpi_lap, &ctx->oxcf, is_sb_size_changed);
    error->setjmp = 0;
  }
  return AOM_CODEC_OK;
}